

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_4_suite::test_ctor(void)

{
  moment<double,_4> filter;
  long local_80;
  ulong local_78;
  undefined1 local_70 [32];
  undefined1 *local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_50 = local_70;
  local_48 = 0;
  local_40 = 4;
  local_38 = 0;
  local_80 = 4;
  local_78 = CONCAT44(local_78._4_4_,4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd5,"void mean_double_4_suite::test_ctor()",&local_80,&local_78);
  local_78._0_1_ = 1;
  local_80._0_1_ = local_48 == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd6,"void mean_double_4_suite::test_ctor()",&local_80,&local_78);
  local_80 = CONCAT71(local_80._1_7_,local_48 == 4);
  local_78 = (ulong)local_78._1_7_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd7,"void mean_double_4_suite::test_ctor()",&local_80,&local_78);
  local_80 = local_48;
  local_78 = local_78 & 0xffffffff00000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd8,"void mean_double_4_suite::test_ctor()",&local_80,&local_78);
  local_80 = local_38;
  local_78 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xd9,"void mean_double_4_suite::test_ctor()",&local_80,&local_78);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<double, 4> filter;
    TRIAL_TEST_EQ(filter.capacity(), 4);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0.0);
}